

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_5::SetEnumVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  bool bVar1;
  mapped_type *pmVar2;
  EnumValueDescriptor *this;
  char *pcVar3;
  mapped_type *this_00;
  FieldDescriptor *in_RDI;
  key_type *in_R9;
  undefined4 in_stack_fffffffffffff318;
  int in_stack_fffffffffffff31c;
  AlphaNum *in_stack_fffffffffffff320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff328;
  char *in_stack_fffffffffffff340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff348;
  allocator *paVar4;
  AlphaNum *in_stack_fffffffffffff358;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff360;
  undefined8 in_stack_fffffffffffff368;
  int bitIndex;
  undefined8 in_stack_fffffffffffff418;
  int bitIndex_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff610;
  FieldGeneratorInfo *in_stack_fffffffffffff618;
  string *this_01;
  undefined4 in_stack_fffffffffffff620;
  undefined4 in_stack_fffffffffffff624;
  allocator local_901;
  string local_900 [39];
  allocator local_8d9;
  string local_8d8 [39];
  allocator local_8b1;
  string local_8b0 [39];
  allocator local_889;
  string local_888 [32];
  string local_868 [39];
  allocator local_841;
  string local_840 [32];
  string local_820 [39];
  allocator local_7f9;
  string local_7f8 [32];
  string local_7d8 [39];
  allocator local_7b1;
  string local_7b0 [32];
  string local_790 [39];
  allocator local_769;
  string local_768 [32];
  string local_748 [39];
  allocator local_721;
  string local_720 [32];
  string local_700 [39];
  allocator local_6d9;
  string local_6d8 [32];
  string local_6b8 [39];
  allocator local_691;
  string local_690 [32];
  string local_670 [39];
  allocator local_649;
  string local_648 [39];
  allocator local_621;
  string local_620 [39];
  allocator local_5f9;
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [39];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [32];
  string local_4d8 [39];
  allocator local_4b1;
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [39];
  allocator local_449;
  string local_448 [32];
  string local_428 [32];
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [39];
  allocator local_379;
  string local_378 [32];
  string local_358 [39];
  allocator local_331;
  string local_330 [32];
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [80];
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [80];
  string local_1a8 [39];
  allocator local_181;
  string local_180 [80];
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  key_type *local_28;
  FieldDescriptor *local_8;
  
  bitIndex = (int)((ulong)in_stack_fffffffffffff368 >> 0x20);
  bitIndex_00 = (int)((ulong)in_stack_fffffffffffff418 >> 0x20);
  local_28 = in_R9;
  local_8 = in_RDI;
  SetCommonFieldVariables
            ((FieldDescriptor *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
             in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  FieldDescriptor::enum_type((FieldDescriptor *)in_stack_fffffffffffff320);
  ClassNameResolver::GetImmutableClassName<google::protobuf::EnumDescriptor>
            ((ClassNameResolver *)in_stack_fffffffffffff328,
             (EnumDescriptor *)in_stack_fffffffffffff320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"type",&local_69);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_48);
  FieldDescriptor::enum_type((FieldDescriptor *)in_stack_fffffffffffff320);
  ClassNameResolver::GetMutableClassName<google::protobuf::EnumDescriptor>
            ((ClassNameResolver *)in_stack_fffffffffffff328,
             (EnumDescriptor *)in_stack_fffffffffffff320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"mutable_type",&local_c1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_a0);
  ImmutableDefaultValue_abi_cxx11_
            ((FieldDescriptor *)in_stack_fffffffffffff328,
             (ClassNameResolver *)in_stack_fffffffffffff320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"default",&local_109);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string(local_e8);
  this = FieldDescriptor::default_value_enum((FieldDescriptor *)in_stack_fffffffffffff320);
  EnumValueDescriptor::number(this);
  strings::AlphaNum::AlphaNum(in_stack_fffffffffffff320,in_stack_fffffffffffff31c);
  StrCat_abi_cxx11_(in_stack_fffffffffffff358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"default_number",&local_181);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,local_130);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_130);
  internal::WireFormat::MakeTag((FieldDescriptor *)in_stack_fffffffffffff320);
  strings::AlphaNum::AlphaNum(in_stack_fffffffffffff320,in_stack_fffffffffffff31c);
  StrCat_abi_cxx11_(in_stack_fffffffffffff358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"tag",&local_1f9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  this_01 = local_1a8;
  std::__cxx11::string::operator=((string *)pmVar2,this_01);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(this_01);
  FieldDescriptor::number(local_8);
  GetType((FieldDescriptor *)0x5b2ed2);
  internal::WireFormat::TagSize
            ((int)((ulong)in_stack_fffffffffffff320 >> 0x20),(Type)in_stack_fffffffffffff320);
  strings::AlphaNum::AlphaNum
            (in_stack_fffffffffffff320,CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318)
            );
  StrCat_abi_cxx11_(in_stack_fffffffffffff358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"tag_size",&local_271);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,local_220);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_220);
  FieldDescriptor::options(local_8);
  bVar1 = FieldOptions::deprecated((FieldOptions *)0x5b2fc8);
  pcVar3 = "";
  if (bVar1) {
    pcVar3 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"deprecation",&local_299);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,pcVar3);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"on_changed",&local_2c1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,"onChanged();");
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"for_number",&local_2e9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,"valueOf");
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  FieldDescriptor::file(local_8);
  bVar1 = SupportFieldPresence((FileDescriptor *)0x5b31b2);
  if (bVar1) {
    GenerateGetBit_abi_cxx11_(bitIndex);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"get_has_field_bit_message",&local_331);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::__cxx11::string::operator=((string *)pmVar2,local_310);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    std::__cxx11::string::~string(local_310);
    GenerateGetBit_abi_cxx11_(bitIndex);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_378,"get_has_field_bit_builder",&local_379);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::__cxx11::string::operator=((string *)pmVar2,local_358);
    std::__cxx11::string::~string(local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    std::__cxx11::string::~string(local_358);
    GenerateSetBit_abi_cxx11_(bitIndex);
    std::operator+(in_stack_fffffffffffff328,(char *)in_stack_fffffffffffff320);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e0,"set_has_field_bit_message",&local_3e1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::__cxx11::string::operator=((string *)pmVar2,local_3a0);
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::string::~string(local_3c0);
    GenerateSetBit_abi_cxx11_(bitIndex);
    std::operator+(in_stack_fffffffffffff328,(char *)in_stack_fffffffffffff320);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_448,"set_has_field_bit_builder",&local_449);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::__cxx11::string::operator=((string *)pmVar2,local_408);
    std::__cxx11::string::~string(local_448);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::string::~string(local_428);
    GenerateClearBit_abi_cxx11_(bitIndex_00);
    std::operator+(in_stack_fffffffffffff328,(char *)in_stack_fffffffffffff320);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4b0,"clear_has_field_bit_builder",&local_4b1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::__cxx11::string::operator=((string *)pmVar2,local_470);
    std::__cxx11::string::~string(local_4b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
    std::__cxx11::string::~string(local_470);
    std::__cxx11::string::~string(local_490);
    GenerateGetBit_abi_cxx11_(bitIndex);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f8,"is_field_present_message",&local_4f9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::__cxx11::string::operator=((string *)pmVar2,local_4d8);
    std::__cxx11::string::~string(local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
    std::__cxx11::string::~string(local_4d8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_520,"set_has_field_bit_message",&local_521);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::__cxx11::string::operator=((string *)pmVar2,"");
    std::__cxx11::string::~string(local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_548,"set_has_field_bit_builder",&local_549);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::__cxx11::string::operator=((string *)pmVar2,"");
    std::__cxx11::string::~string(local_548);
    std::allocator<char>::~allocator((allocator<char> *)&local_549);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_570,"clear_has_field_bit_builder",&local_571);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::__cxx11::string::operator=((string *)pmVar2,"");
    std::__cxx11::string::~string(local_570);
    std::allocator<char>::~allocator((allocator<char> *)&local_571);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5f8,"name",&local_5f9);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::operator+(in_stack_fffffffffffff348,in_stack_fffffffffffff340);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_620,"default",&local_621);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::operator+(in_stack_fffffffffffff328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff320);
    std::operator+(in_stack_fffffffffffff328,(char *)in_stack_fffffffffffff320);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_648,"is_field_present_message",&local_649);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::__cxx11::string::operator=((string *)pmVar2,local_598);
    std::__cxx11::string::~string(local_648);
    std::allocator<char>::~allocator((allocator<char> *)&local_649);
    std::__cxx11::string::~string(local_598);
    std::__cxx11::string::~string(local_5b8);
    std::__cxx11::string::~string(local_620);
    std::allocator<char>::~allocator((allocator<char> *)&local_621);
    std::__cxx11::string::~string(local_5d8);
    std::__cxx11::string::~string(local_5f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  }
  GenerateGetBit_abi_cxx11_(bitIndex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_690,"get_mutable_bit_builder",&local_691);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,local_670);
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  std::__cxx11::string::~string(local_670);
  GenerateSetBit_abi_cxx11_(bitIndex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"set_mutable_bit_builder",&local_6d9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,local_6b8);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  std::__cxx11::string::~string(local_6b8);
  GenerateClearBit_abi_cxx11_(bitIndex_00);
  paVar4 = &local_721;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"clear_mutable_bit_builder",paVar4);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,local_700);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  std::__cxx11::string::~string(local_700);
  GenerateGetBitMutableLocal_abi_cxx11_(bitIndex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_768,"get_mutable_bit_parser",&local_769);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,local_748);
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  std::__cxx11::string::~string(local_748);
  GenerateSetBitMutableLocal_abi_cxx11_(bitIndex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"set_mutable_bit_parser",&local_7b1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,local_790);
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  std::__cxx11::string::~string(local_790);
  GenerateGetBitFromLocal_abi_cxx11_(bitIndex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f8,"get_has_field_bit_from_local",&local_7f9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,local_7d8);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  std::__cxx11::string::~string(local_7d8);
  GenerateSetBitToLocal_abi_cxx11_(bitIndex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"set_has_field_bit_to_local",&local_841);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=((string *)pmVar2,local_820);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  std::__cxx11::string::~string(local_820);
  FieldDescriptor::file(local_8);
  bVar1 = SupportUnknownEnumValue((FileDescriptor *)0x5b46c6);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_888,"type",&local_889);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::operator+(in_stack_fffffffffffff348,in_stack_fffffffffffff340);
    paVar4 = &local_8b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8b0,"unknown",paVar4);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)paVar4,local_28);
    std::__cxx11::string::operator=((string *)pmVar2,local_868);
    std::__cxx11::string::~string(local_8b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
    std::__cxx11::string::~string(local_868);
    std::__cxx11::string::~string(local_888);
    std::allocator<char>::~allocator((allocator<char> *)&local_889);
  }
  else {
    paVar4 = &local_8d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8d8,"default",paVar4);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_900,"unknown",&local_901);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](in_stack_fffffffffffff360,(key_type *)in_stack_fffffffffffff358);
    std::__cxx11::string::operator=((string *)this_00,(string *)pmVar2);
    std::__cxx11::string::~string(local_900);
    std::allocator<char>::~allocator((allocator<char> *)&local_901);
    std::__cxx11::string::~string(local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  }
  return;
}

Assistant:

void SetEnumVariables(const FieldDescriptor* descriptor, int messageBitIndex,
                      int builderBitIndex, const FieldGeneratorInfo* info,
                      ClassNameResolver* name_resolver,
                      std::map<std::string, std::string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);

  (*variables)["type"] =
      name_resolver->GetImmutableClassName(descriptor->enum_type());
  (*variables)["mutable_type"] =
      name_resolver->GetMutableClassName(descriptor->enum_type());
  (*variables)["default"] = ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["default_number"] =
      StrCat(descriptor->default_value_enum()->number());
  (*variables)["tag"] = StrCat(
      static_cast<int32>(internal::WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = StrCat(
      internal::WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  (*variables)["on_changed"] = "onChanged();";
  // Use deprecated valueOf() method to be compatible with old generated code
  // for v2.5.0/v2.6.1.
  // TODO(xiaofeng): Use "forNumber" when we no longer support compatibility
  // with v2.5.0/v2.6.1, and remove the @SuppressWarnings annotations.
  (*variables)["for_number"] = "valueOf";

  if (SupportFieldPresence(descriptor->file())) {
    // For singular messages and builders, one bit is used for the hasField bit.
    (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);
    (*variables)["get_has_field_bit_builder"] = GenerateGetBit(builderBitIndex);

    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        GenerateSetBit(messageBitIndex) + ";";
    (*variables)["set_has_field_bit_builder"] =
        GenerateSetBit(builderBitIndex) + ";";
    (*variables)["clear_has_field_bit_builder"] =
        GenerateClearBit(builderBitIndex) + ";";

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["set_has_field_bit_builder"] = "";
    (*variables)["clear_has_field_bit_builder"] = "";

    (*variables)["is_field_present_message"] =
        (*variables)["name"] + "_ != " + (*variables)["default"] +
        ".getNumber()";
  }

  // For repated builders, one bit is used for whether the array is immutable.
  (*variables)["get_mutable_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_mutable_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_mutable_bit_builder"] = GenerateClearBit(builderBitIndex);

  // For repeated fields, one bit is used for whether the array is immutable
  // in the parsing constructor.
  (*variables)["get_mutable_bit_parser"] =
      GenerateGetBitMutableLocal(builderBitIndex);
  (*variables)["set_mutable_bit_parser"] =
      GenerateSetBitMutableLocal(builderBitIndex);

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);

  if (SupportUnknownEnumValue(descriptor->file())) {
    (*variables)["unknown"] = (*variables)["type"] + ".UNRECOGNIZED";
  } else {
    (*variables)["unknown"] = (*variables)["default"];
  }
}